

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::verify
          (LinearDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *scale;
  Vec4 *bias;
  ostringstream *poVar1;
  Precision precision;
  ulong uVar2;
  Vec4 VVar3;
  bool bVar4;
  int i;
  DataType DVar5;
  int iVar6;
  undefined7 extraout_var;
  undefined8 uVar7;
  RenderTarget *pRVar8;
  _Alloc_hider *p_Var9;
  undefined7 extraout_var_00;
  float *pfVar10;
  long lVar11;
  EVP_PKEY_CTX *pEVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  float fVar21;
  float afVar18 [4];
  undefined1 auVar19 [16];
  float fVar22;
  undefined1 auVar20 [16];
  float fVar29;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar30;
  undefined1 auVar28 [16];
  float fVar31;
  float fVar33;
  uint uVar34;
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 uVar40;
  Vector<float,_2> res_5;
  Vec4 threshold_1;
  Vec4 reference;
  Vec4 threshold;
  float local_218 [4];
  PixelBufferAccess *local_208;
  undefined8 uStack_200;
  Vec4 surfaceThreshold;
  float local_1e8 [4];
  Vec4 opThreshold;
  Vector<float,_4> res_17;
  Vector<float,_4> res_2;
  _Alloc_hider local_1a8;
  size_type sStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [5];
  ios_base local_140 [272];
  long lVar39;
  
  local_218[0] = 1.0;
  local_218[1] = 0.0;
  local_218[2] = 0.5;
  local_218[3] = -0.5;
  local_1e8[0] = 0.0;
  local_1e8[1] = 1.0;
  local_1e8[2] = 0.5;
  local_1e8[3] = -0.5;
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&res_2);
  scale = &(this->super_TriangleDerivateCase).m_derivScale;
  auVar23 = *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data;
  auVar27._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
  auVar27._8_4_ = auVar23._8_4_ ^ 0x80000000;
  auVar27._12_4_ = auVar23._12_4_ ^ 0x80000000;
  auVar23 = maxps(auVar27,auVar23);
  afVar18 = (float  [4])divps(res_2.m_data,auVar23);
  surfaceThreshold.m_data[0] = afVar18[0];
  surfaceThreshold.m_data[1] = afVar18[1];
  surfaceThreshold.m_data[2] = afVar18[2];
  surfaceThreshold.m_data[3] = afVar18[3];
  uVar34 = *(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (uVar34 < 2) {
    pEVar12 = ctx + 0xc;
    if (uVar34 == 0) {
      pEVar12 = ctx + 8;
    }
    pfVar10 = local_1e8;
    if (uVar34 == 0) {
      pfVar10 = local_218;
    }
    fVar21 = *pfVar10;
    fVar22 = pfVar10[1];
    fVar31 = pfVar10[2];
    fVar33 = pfVar10[3];
    auVar24._0_4_ = (float)*(int *)pEVar12;
    auVar35._0_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[0] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[0];
    auVar35._4_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[1] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[1];
    auVar35._8_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[2] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
    auVar35._12_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[3] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[3];
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    auVar23 = divps(auVar35,auVar24);
    reference.m_data[1] = auVar23._4_4_ * fVar22;
    reference.m_data[0] = auVar23._0_4_ * fVar21;
    reference.m_data[2] = auVar23._8_4_ * fVar31;
    reference.m_data[3] = auVar23._12_4_ * fVar33;
    res_2.m_data[1] = (this->super_TriangleDerivateCase).m_coordMin.m_data[1] * fVar22;
    res_2.m_data[0] = (this->super_TriangleDerivateCase).m_coordMin.m_data[0] * fVar21;
    res_2.m_data[2] = (this->super_TriangleDerivateCase).m_coordMin.m_data[2] * fVar31;
    res_2.m_data[3] = (this->super_TriangleDerivateCase).m_coordMin.m_data[3] * fVar33;
    threshold.m_data[1] = (this->super_TriangleDerivateCase).m_coordMax.m_data[1] * fVar22;
    threshold.m_data[0] = (this->super_TriangleDerivateCase).m_coordMax.m_data[0] * fVar21;
    threshold.m_data[3] = (this->super_TriangleDerivateCase).m_coordMax.m_data[3] * fVar33;
    threshold.m_data[2] = (this->super_TriangleDerivateCase).m_coordMax.m_data[2] * fVar31;
    getDerivateThreshold
              ((Functional *)&opThreshold,(this->super_TriangleDerivateCase).m_precision,&res_2,
               &threshold,&reference);
    threshold.m_data[1] =
         (float)(~-(uint)(opThreshold.m_data[1] <= surfaceThreshold.m_data[1]) &
                 (uint)opThreshold.m_data[1] |
                (uint)surfaceThreshold.m_data[1] &
                -(uint)(opThreshold.m_data[1] <= surfaceThreshold.m_data[1]));
    threshold.m_data[0] =
         (float)(~-(uint)(opThreshold.m_data[0] <= surfaceThreshold.m_data[0]) &
                 (uint)opThreshold.m_data[0] |
                (uint)surfaceThreshold.m_data[0] &
                -(uint)(opThreshold.m_data[0] <= surfaceThreshold.m_data[0]));
    threshold.m_data[3] =
         (float)(~-(uint)(opThreshold.m_data[3] <= surfaceThreshold.m_data[3]) &
                 (uint)opThreshold.m_data[3] |
                (uint)surfaceThreshold.m_data[3] &
                -(uint)(opThreshold.m_data[3] <= surfaceThreshold.m_data[3]));
    threshold.m_data[2] =
         (float)(~-(uint)(opThreshold.m_data[2] <= surfaceThreshold.m_data[2]) &
                 (uint)opThreshold.m_data[2] |
                (uint)surfaceThreshold.m_data[2] &
                -(uint)(opThreshold.m_data[2] <= surfaceThreshold.m_data[2]));
    DVar5 = glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
    res_2.m_data._0_8_ =
         ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    poVar1 = (ostringstream *)(res_2.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying result image.\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tValid derivative is ",0x15);
    VVar3 = reference;
    if (DVar5 == TYPE_FLOAT_VEC3) {
      res_5.m_data[0] = reference.m_data[0];
      res_5.m_data[1] = reference.m_data[1];
      reference = VVar3;
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_5);
    }
    else if (DVar5 == TYPE_FLOAT_VEC2) {
      res_5.m_data[0] = reference.m_data[0];
      res_5.m_data[1] = reference.m_data[1];
      reference = VVar3;
      tcu::operator<<((ostream *)poVar1,&res_5);
    }
    else if (DVar5 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)reference.m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,&reference);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
    if (DVar5 == TYPE_FLOAT_VEC3) {
      res_5.m_data[0] = threshold.m_data[0];
      res_5.m_data[1] = threshold.m_data[1];
      tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_5);
    }
    else if (DVar5 == TYPE_FLOAT_VEC2) {
      res_5.m_data[0] = threshold.m_data[0];
      res_5.m_data[1] = threshold.m_data[1];
      tcu::operator<<((ostream *)poVar1,&res_5);
    }
    else if (DVar5 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)threshold.m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)poVar1,&threshold);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
    bias = &(this->super_TriangleDerivateCase).m_derivBias;
    bVar4 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                       (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                       &reference,&threshold,scale,bias,LOG_NOTHING);
    if (bVar4) {
      poVar1 = (ostringstream *)(res_2.m_data + 2);
      res_2.m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"No incorrect derivatives found, result valid.",0x2d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      uVar7 = std::ios_base::~ios_base(local_140);
      iVar6 = (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
    else {
      poVar1 = (ostringstream *)(res_2.m_data + 2);
      res_2.m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                 ,0x69);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "\tVerifying each result derivative is within its range of legal result values.",
                 0x4d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
        pRVar8 = Context::getRenderTarget
                           ((this->super_TriangleDerivateCase).super_TestCase.m_context);
        local_208._0_4_ = pRVar8->m_width;
        local_208._4_4_ = pRVar8->m_height;
        uStack_200._0_4_ = (pRVar8->m_pixelFormat).redBits;
        uStack_200._4_4_ = (pRVar8->m_pixelFormat).greenBits;
        pRVar8 = Context::getRenderTarget
                           ((this->super_TriangleDerivateCase).super_TestCase.m_context);
        uVar34 = -(uint)(pRVar8->m_height < 0x67);
        auVar20._0_4_ =
             (float)(int)(~-(uint)((int)(uint)local_208 < 0xa7) & 0xa7 |
                         (uint)local_208 & -(uint)((int)(uint)local_208 < 0xa7));
        auVar20._4_4_ = (float)(int)(~uVar34 & 0x67 | pRVar8->m_height & uVar34);
        auVar20._8_4_ = (float)(int)((uint)uStack_200 & -(uint)((int)(uint)uStack_200 < 0));
        auVar20._12_4_ = (float)(int)(uStack_200._4_4_ & -(uint)(uStack_200 < 0));
      }
      else {
        auVar20 = ZEXT816(0x4305000042c60000);
      }
      fVar21 = (this->super_TriangleDerivateCase).m_coordMin.m_data[0];
      fVar22 = (this->super_TriangleDerivateCase).m_coordMin.m_data[1];
      fVar31 = (this->super_TriangleDerivateCase).m_coordMax.m_data[0];
      fVar33 = (this->super_TriangleDerivateCase).m_coordMax.m_data[1];
      fVar29 = (this->super_TriangleDerivateCase).m_coordMax.m_data[2] -
               (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
      fVar30 = (this->super_TriangleDerivateCase).m_coordMax.m_data[3] -
               (this->super_TriangleDerivateCase).m_coordMin.m_data[3];
      p_Var9 = &local_1a8;
      local_198[0]._M_allocated_capacity = 0;
      local_198[0]._8_8_ = 0;
      local_1a8._M_p = (pointer)0x0;
      sStack_1a0 = 0;
      res_2.m_data = (float  [4])ZEXT816(0);
      lVar11 = 0;
      lVar13 = 0;
      do {
        lVar14 = 0;
        auVar38 = _DAT_019fcc00;
        do {
          bVar4 = SUB164(auVar38 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                  SUB164(auVar38 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
          if (bVar4) {
            uVar40 = 0x3f800000;
            if (lVar11 != lVar14) {
              uVar40 = 0;
            }
            *(undefined4 *)((long)&p_Var9[-2]._M_p + lVar14) = uVar40;
          }
          if (bVar4) {
            uVar40 = 0x3f800000;
            if (lVar11 + -0x10 != lVar14) {
              uVar40 = 0;
            }
            *(undefined4 *)((long)&p_Var9->_M_p + lVar14) = uVar40;
          }
          lVar39 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 2;
          auVar38._8_8_ = lVar39 + 2;
          lVar14 = lVar14 + 0x20;
        } while (lVar14 != 0x40);
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 0x10;
        p_Var9 = (_Alloc_hider *)((long)&p_Var9->_M_p + 4);
      } while (lVar13 != 4);
      res_5.m_data[1] = 0.0;
      res_5.m_data[0] = (fVar31 - fVar21) / auVar20._0_4_;
      lVar11 = 0;
      do {
        res_2.m_data[lVar11] = *(float *)((long)res_5.m_data + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      res_5.m_data = (float  [2])((ulong)(uint)((fVar33 - fVar22) / auVar20._4_4_) << 0x20);
      lVar11 = 1;
      do {
        res_2.m_data[lVar11] = *(float *)(&stack0xfffffffffffffd97 + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xd);
      fVar21 = (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
      auVar37._4_4_ = fVar29;
      auVar37._0_4_ = fVar29;
      auVar37._8_4_ = fVar30;
      auVar37._12_4_ = fVar30;
      auVar23 = divps(auVar37,auVar20);
      threshold_1.m_data[0] = (float)auVar23._0_8_;
      threshold_1.m_data[1] = SUB84(auVar23._0_8_,4);
      threshold_1.m_data[2] = fVar21 + fVar21;
      res_5.m_data[0] = 0.0;
      res_5.m_data[1] = 0.0;
      lVar11 = 0;
      do {
        res_5.m_data[lVar11] = threshold_1.m_data[lVar11] * 0.5;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar11 = 2;
      do {
        res_2.m_data[lVar11] = *(float *)(&stack0xfffffffffffffd96 + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xe);
      fVar21 = (this->super_TriangleDerivateCase).m_coordMax.m_data[3];
      auVar28._0_8_ = CONCAT44(fVar30,fVar30) ^ 0x8000000080000000;
      auVar28._8_4_ = -fVar30;
      auVar28._12_4_ = -fVar30;
      auVar23 = divps(auVar28,auVar20);
      threshold_1.m_data[0] = (float)auVar23._0_8_;
      threshold_1.m_data[1] = SUB84(auVar23._0_8_,4);
      threshold_1.m_data[2] = fVar21 + fVar21;
      res_5.m_data[0] = 0.0;
      res_5.m_data[1] = 0.0;
      lVar11 = 0;
      do {
        res_5.m_data[lVar11] = threshold_1.m_data[lVar11] * 0.5;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar11 = 3;
      do {
        res_2.m_data[lVar11] = *(float *)(&stack0xfffffffffffffd95 + lVar11);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xf);
      bVar4 = reverifyConstantDerivateWithFlushRelaxations
                        (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                         (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                         (this->super_TriangleDerivateCase).m_precision,scale,bias,&surfaceThreshold
                         ,*(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                         (Linear2DFunctionEvaluator *)&res_2);
      iVar6 = (int)CONCAT71(extraout_var_00,bVar4);
    }
  }
  else {
    auVar23._0_4_ = (float)*(int *)(ctx + 8);
    auVar25._0_4_ = (float)*(int *)(ctx + 0xc);
    auVar36._0_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[0] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[0];
    auVar36._4_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[1] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[1];
    auVar36._8_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[2] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
    auVar36._12_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[3] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[3];
    auVar23._4_4_ = auVar23._0_4_;
    auVar23._8_4_ = auVar23._0_4_;
    auVar23._12_4_ = auVar23._0_4_;
    auVar23 = divps(auVar36,auVar23);
    res_2.m_data[0] = auVar23._0_4_ * local_218[0];
    res_2.m_data[1] = auVar23._4_4_ * local_218[1];
    res_2.m_data[2] = auVar23._8_4_ * local_218[2];
    res_2.m_data[3] = auVar23._12_4_ * local_218[3];
    auVar32._0_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[0] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[0];
    auVar32._4_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[1] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[1];
    auVar32._8_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[2] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
    auVar32._12_4_ =
         (this->super_TriangleDerivateCase).m_coordMax.m_data[3] -
         (this->super_TriangleDerivateCase).m_coordMin.m_data[3];
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar23 = divps(auVar32,auVar25);
    reference.m_data[0] = auVar23._0_4_ * local_1e8[0];
    reference.m_data[1] = auVar23._4_4_ * local_1e8[1];
    reference.m_data[2] = auVar23._8_4_ * local_1e8[2];
    reference.m_data[3] = auVar23._12_4_ * local_1e8[3];
    uVar2 = CONCAT44(res_2.m_data[1],res_2.m_data[0]);
    auVar26._0_8_ = uVar2 ^ 0x8000000080000000;
    auVar26._8_4_ = -res_2.m_data[2];
    auVar26._12_4_ = -res_2.m_data[3];
    auVar27 = maxps(auVar26,(undefined1  [16])res_2.m_data);
    uVar2 = CONCAT44(reference.m_data[1],reference.m_data[0]);
    auVar19._0_8_ = uVar2 ^ 0x8000000080000000;
    auVar19._8_4_ = -reference.m_data[2];
    auVar19._12_4_ = -reference.m_data[3];
    auVar23 = maxps(auVar19,(undefined1  [16])reference.m_data);
    opThreshold.m_data[0] = auVar23._0_4_ + auVar27._0_4_;
    opThreshold.m_data[1] = auVar23._4_4_ + auVar27._4_4_;
    opThreshold.m_data[2] = auVar23._8_4_ + auVar27._8_4_;
    opThreshold.m_data[3] = auVar23._12_4_ + auVar27._12_4_;
    precision = (this->super_TriangleDerivateCase).m_precision;
    fVar21 = (this->super_TriangleDerivateCase).m_coordMin.m_data[2] * local_218[2];
    fVar22 = (this->super_TriangleDerivateCase).m_coordMin.m_data[3] * local_218[3];
    res_5.m_data[1] = (this->super_TriangleDerivateCase).m_coordMin.m_data[1] * local_218[1];
    res_5.m_data[0] = (this->super_TriangleDerivateCase).m_coordMin.m_data[0] * local_218[0];
    threshold_1.m_data[1] = (this->super_TriangleDerivateCase).m_coordMax.m_data[1] * local_218[1];
    threshold_1.m_data[0] = (this->super_TriangleDerivateCase).m_coordMax.m_data[0] * local_218[0];
    threshold_1.m_data[3] = (this->super_TriangleDerivateCase).m_coordMax.m_data[3] * local_218[3];
    threshold_1.m_data[2] = (this->super_TriangleDerivateCase).m_coordMax.m_data[2] * local_218[2];
    local_208 = (PixelBufferAccess *)sig;
    getDerivateThreshold((Functional *)&threshold,precision,(Vec4 *)&res_5,&threshold_1,&res_2);
    threshold_1.m_data[1] = (this->super_TriangleDerivateCase).m_coordMin.m_data[1] * local_1e8[1];
    threshold_1.m_data[0] = (this->super_TriangleDerivateCase).m_coordMin.m_data[0] * local_1e8[0];
    threshold_1.m_data[3] = (this->super_TriangleDerivateCase).m_coordMin.m_data[3] * local_1e8[3];
    threshold_1.m_data[2] = (this->super_TriangleDerivateCase).m_coordMin.m_data[2] * local_1e8[2];
    res_17.m_data[1] = (this->super_TriangleDerivateCase).m_coordMax.m_data[1] * local_1e8[1];
    res_17.m_data[0] = (this->super_TriangleDerivateCase).m_coordMax.m_data[0] * local_1e8[0];
    res_17.m_data[3] = (this->super_TriangleDerivateCase).m_coordMax.m_data[3] * local_1e8[3];
    res_17.m_data[2] = (this->super_TriangleDerivateCase).m_coordMax.m_data[2] * local_1e8[2];
    getDerivateThreshold((Functional *)&res_5,precision,&threshold_1,&res_17,&reference);
    uVar34 = -(uint)(fVar21 <= threshold.m_data[2]);
    uVar16 = -(uint)(fVar22 <= threshold.m_data[3]);
    fVar31 = (float)(~-(uint)(res_5.m_data[0] <= threshold.m_data[0]) & (uint)res_5.m_data[0] |
                    (uint)threshold.m_data[0] & -(uint)(res_5.m_data[0] <= threshold.m_data[0]));
    fVar33 = (float)(~-(uint)(res_5.m_data[1] <= threshold.m_data[1]) & (uint)res_5.m_data[1] |
                    (uint)threshold.m_data[1] & -(uint)(res_5.m_data[1] <= threshold.m_data[1]));
    fVar21 = (float)(~uVar34 & (uint)fVar21 | (uint)threshold.m_data[2] & uVar34);
    fVar22 = (float)(~uVar16 & (uint)fVar22 | (uint)threshold.m_data[3] & uVar16);
    uVar34 = -(uint)(fVar31 <= surfaceThreshold.m_data[0]);
    uVar16 = -(uint)(fVar33 <= surfaceThreshold.m_data[1]);
    uVar15 = -(uint)(fVar21 <= surfaceThreshold.m_data[2]);
    uVar17 = -(uint)(fVar22 <= surfaceThreshold.m_data[3]);
    threshold_1.m_data[1] =
         (float)(~uVar16 & (uint)fVar33 | (uint)surfaceThreshold.m_data[1] & uVar16);
    threshold_1.m_data[0] =
         (float)(~uVar34 & (uint)fVar31 | (uint)surfaceThreshold.m_data[0] & uVar34);
    threshold_1.m_data[3] =
         (float)(~uVar17 & (uint)fVar22 | (uint)surfaceThreshold.m_data[3] & uVar17);
    threshold_1.m_data[2] =
         (float)(~uVar15 & (uint)fVar21 | (uint)surfaceThreshold.m_data[2] & uVar15);
    bVar4 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,local_208,
                       (this->super_TriangleDerivateCase).m_dataType,&opThreshold,&threshold_1,scale
                       ,&(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
    iVar6 = (int)CONCAT71(extraout_var,bVar4);
  }
  return iVar6;
}

Assistant:

bool LinearDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_derivScale);

	if (m_func == DERIVATE_DFDX || m_func == DERIVATE_DFDY)
	{
		const bool			isX			= m_func == DERIVATE_DFDX;
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		const tcu::Vec4		reference	= ((m_coordMax - m_coordMin) / div) * scale;
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_precision, m_coordMin*scale, m_coordMax*scale, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_dataType);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								   reference, threshold, m_derivScale, m_derivBias,
								   LOG_NOTHING))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::IVec2			viewportSize	= getViewportSize();
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_coordMax - m_coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_coordMin.z() + m_coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_coordMax.w() + m_coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_testCtx.getLog(), result, errorMask,
																m_dataType, m_precision, m_derivScale,
																m_derivBias, surfaceThreshold, m_func,
																function);
		}
	}
	else
	{
		DE_ASSERT(m_func == DERIVATE_FWIDTH);
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_coordMax - m_coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_coordMax - m_coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_precision, m_coordMin*xScale, m_coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_precision, m_coordMin*yScale, m_coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
									  reference, threshold, m_derivScale, m_derivBias);
	}
}